

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void google::protobuf::internal::SwapFieldHelper::SwapInlinedStrings<true>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  ReflectionSchema *this;
  uint32_t uVar1;
  ulong uVar2;
  string *psVar3;
  ulong uVar4;
  SwapFieldHelper local_40 [16];
  
  uVar2 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  uVar4 = (rhs->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    uVar4 = *(ulong *)(uVar4 & 0xfffffffffffffffe);
  }
  psVar3 = (string *)Reflection::MutableRawImpl(r,lhs,field);
  Reflection::MutableRawImpl(r,rhs,field);
  this = &r->schema_;
  uVar1 = ReflectionSchema::InlinedStringIndex(this,field);
  if (uVar1 == 0) {
    SwapInlinedStrings<true>(local_40);
LAB_00285b5b:
    SwapInlinedStrings<true>(local_40);
  }
  else {
    if ((r->schema_).inlined_string_donated_offset_ == -1) goto LAB_00285b5b;
    ReflectionSchema::InlinedStringDonatedOffset(this);
    if ((r->schema_).inlined_string_donated_offset_ != -1) {
      ReflectionSchema::InlinedStringDonatedOffset(this);
      if (uVar2 == uVar4) {
        std::__cxx11::string::swap(psVar3);
        return;
      }
      goto LAB_00285b6f;
    }
  }
  SwapInlinedStrings<true>(local_40);
LAB_00285b6f:
  SwapInlinedStrings<true>();
}

Assistant:

void SwapFieldHelper::SwapInlinedStrings(const Reflection* r, Message* lhs,
                                         Message* rhs,
                                         const FieldDescriptor* field) {
  // Inlined string field.
  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();
  auto* lhs_string = r->MutableRaw<InlinedStringField>(lhs, field);
  auto* rhs_string = r->MutableRaw<InlinedStringField>(rhs, field);
  uint32_t index = r->schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  uint32_t* lhs_array = r->MutableInlinedStringDonatedArray(lhs);
  uint32_t* rhs_array = r->MutableInlinedStringDonatedArray(rhs);
  uint32_t* lhs_state = &lhs_array[index / 32];
  uint32_t* rhs_state = &rhs_array[index / 32];
  bool lhs_arena_dtor_registered = (lhs_array[0] & 0x1u) == 0;
  bool rhs_arena_dtor_registered = (rhs_array[0] & 0x1u) == 0;
  const uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
  if (unsafe_shallow_swap) {
    ABSL_DCHECK_EQ(lhs_arena, rhs_arena);
    InlinedStringField::InternalSwap(lhs_string, lhs_arena_dtor_registered, lhs,
                                     rhs_string, rhs_arena_dtor_registered, rhs,
                                     lhs_arena);
  } else {
    const std::string temp = lhs_string->Get();
    lhs_string->Set(rhs_string->Get(), lhs_arena,
                    r->IsInlinedStringDonated(*lhs, field), lhs_state, mask,
                    lhs);
    rhs_string->Set(temp, rhs_arena, r->IsInlinedStringDonated(*rhs, field),
                    rhs_state, mask, rhs);
  }
}